

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSoftBodyTriangleCallback::processTriangle
          (btSoftBodyTriangleCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  uint uVar1;
  int iVar2;
  btCollisionShape *pbVar3;
  void *pvVar4;
  btCollisionShape *pbVar5;
  btTransform *pbVar6;
  undefined4 extraout_var;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this_00;
  btCollisionShape *this_01;
  long *plVar7;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  btCollisionAlgorithm *colAlgo_1;
  btCollisionObjectWrapper triBody_1;
  btCollisionObjectWrapper softBody_1;
  btConvexHullShape *tm_1;
  btVector3 pts [6];
  btVector3 normal;
  btCollisionAlgorithm *colAlgo;
  btCollisionObjectWrapper triBody;
  btCollisionObjectWrapper softBody;
  btCollisionShape *tm;
  btTriIndex *shapeIndex;
  btHashKey<btTriIndex> triKey;
  btTriIndex triIndex;
  btTransform *tr;
  btVector3 color;
  btCollisionAlgorithmConstructionInfo ci;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex> *in_stack_fffffffffffffd30;
  btVector3 *in_stack_fffffffffffffd38;
  btVector3 *in_stack_fffffffffffffd40;
  btVector3 *in_stack_fffffffffffffd58;
  btCollisionObject *pbVar8;
  btTransform *in_stack_fffffffffffffd60;
  btTriIndex *value;
  undefined8 in_stack_fffffffffffffd90;
  btScalar *in_stack_fffffffffffffd98;
  btConvexHullShape *in_stack_fffffffffffffda0;
  btCollisionObjectWrapper local_230;
  btCollisionObjectWrapper local_208;
  btCollisionShape *local_1d0;
  btVector3 local_1c8;
  btScalar local_1b8 [4];
  btScalar local_1a8 [4];
  btScalar local_198 [4];
  btScalar local_188 [4];
  btScalar local_178 [4];
  btScalar local_164;
  btScalar local_160 [4];
  btScalar local_150 [4];
  btTriIndex local_140;
  long *local_130;
  btCollisionObjectWrapper local_128;
  btCollisionObjectWrapper local_100;
  btCollisionShape *local_d8;
  btTriIndex *local_d0;
  btHashKey<btTriIndex> local_c4;
  btTriIndex local_c0;
  btScalar local_b0 [4];
  btScalar local_a0 [4];
  btScalar local_90 [4];
  btScalar local_80 [4];
  btScalar local_70 [4];
  btScalar local_60 [4];
  btTransform *local_50;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btVector3 local_38;
  btCollisionAlgorithmConstructionInfo local_28;
  int local_18;
  int local_14;
  undefined4 extraout_var_00;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  btCollisionAlgorithmConstructionInfo::btCollisionAlgorithmConstructionInfo(&local_28);
  local_28.m_dispatcher1 = *(btDispatcher **)(in_RDI + 0x40);
  if ((*(long *)(in_RDI + 0x48) != 0) && (*(long *)(*(long *)(in_RDI + 0x48) + 0x18) != 0)) {
    uVar1 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x48) + 0x18) + 0x70))();
    if ((uVar1 & 1) != 0) {
      local_3c = 1.0;
      local_40 = 1.0;
      local_44 = 0.0;
      btVector3::btVector3(&local_38,&local_3c,&local_40,&local_44);
      local_50 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 0x10));
      in_stack_fffffffffffffda0 = *(btConvexHullShape **)(*(long *)(in_RDI + 0x48) + 0x18);
      local_60 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_70 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      (*(in_stack_fffffffffffffda0->super_btPolyhedralConvexAabbCachingShape).
        super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape[4])
                (in_stack_fffffffffffffda0,local_60,local_70,&local_38);
      plVar7 = *(long **)(*(long *)(in_RDI + 0x48) + 0x18);
      local_80 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_90 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      (**(code **)(*plVar7 + 0x20))(plVar7,local_80,local_90,&local_38);
      plVar7 = *(long **)(*(long *)(in_RDI + 0x48) + 0x18);
      local_a0 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      local_b0 = (btScalar  [4])
                 btTransform::operator()(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      (**(code **)(*plVar7 + 0x20))(plVar7,local_a0,local_b0,&local_38);
    }
  }
  btTriIndex::btTriIndex(&local_c0,local_14,local_18,(btCollisionShape *)0x0);
  iVar2 = btTriIndex::getUid(&local_c0);
  btHashKey<btTriIndex>::btHashKey(&local_c4,iVar2);
  local_d0 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::operator[]
                       (in_stack_fffffffffffffd30,
                        (btHashKey<btTriIndex> *)
                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  if (local_d0 == (btTriIndex *)0x0) {
    local_150 = (btScalar  [4])operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_160 = (btScalar  [4])operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_140 = (btTriIndex)btVector3::cross(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    value = &local_140;
    btVector3::normalize((btVector3 *)in_stack_fffffffffffffd30);
    local_164 = 0.06;
    btVector3::operator*=((btVector3 *)value,&local_164);
    local_1c8 = operator+(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_1b8 = (btScalar  [4])operator+(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_1a8 = (btScalar  [4])operator+(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_198 = (btScalar  [4])operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_188 = (btScalar  [4])operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_178 = (btScalar  [4])operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    pbVar5 = (btCollisionShape *)btConvexHullShape::operator_new(0x28cb52);
    this_00 = (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)btVector3::getX(&local_1c8);
    btConvexHullShape::btConvexHullShape
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
    pbVar3 = pbVar5;
    local_1d0 = pbVar5;
    this_01 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 0x10));
    pvVar4 = btCollisionShape::getUserPointer(this_01);
    btCollisionShape::setUserPointer(pbVar5,pvVar4);
    pbVar5 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 8));
    pbVar8 = *(btCollisionObject **)(in_RDI + 8);
    pbVar6 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 8));
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_208,(btCollisionObjectWrapper *)0x0,pbVar5,pbVar8,pbVar6,-1,-1);
    pbVar5 = local_1d0;
    pbVar8 = *(btCollisionObject **)(in_RDI + 0x10);
    pbVar6 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 0x10));
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_230,(btCollisionObjectWrapper *)0x0,pbVar5,pbVar8,pbVar6,local_14,local_18);
    iVar2 = (*(local_28.m_dispatcher1)->_vptr_btDispatcher[2])
                      (local_28.m_dispatcher1,&local_208,&local_230,0);
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar2);
    (**(code **)(*plVar7 + 0x10))
              (plVar7,&local_208,&local_230,*(undefined8 *)(in_RDI + 0x48),
               *(undefined8 *)(in_RDI + 0x38));
    (**(code **)*plVar7)();
    (*(local_28.m_dispatcher1)->_vptr_btDispatcher[0xf])(local_28.m_dispatcher1,plVar7);
    local_c0.m_childShape = local_1d0;
    btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert
              (this_00,(btHashKey<btTriIndex> *)pbVar3,value);
  }
  else {
    pbVar5 = local_d0->m_childShape;
    local_d8 = pbVar5;
    pbVar3 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 0x10));
    pvVar4 = btCollisionShape::getUserPointer(pbVar3);
    btCollisionShape::setUserPointer(pbVar5,pvVar4);
    pbVar5 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 8));
    pbVar8 = *(btCollisionObject **)(in_RDI + 8);
    pbVar6 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 8));
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_100,(btCollisionObjectWrapper *)0x0,pbVar5,pbVar8,pbVar6,-1,-1);
    pbVar8 = *(btCollisionObject **)(in_RDI + 0x10);
    pbVar5 = local_d8;
    pbVar6 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 0x10));
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_128,(btCollisionObjectWrapper *)0x0,pbVar5,pbVar8,pbVar6,local_14,local_18);
    iVar2 = (*(local_28.m_dispatcher1)->_vptr_btDispatcher[2])
                      (local_28.m_dispatcher1,&local_100,&local_128,0);
    local_130 = (long *)CONCAT44(extraout_var,iVar2);
    (**(code **)(*local_130 + 0x10))
              (local_130,&local_100,&local_128,*(undefined8 *)(in_RDI + 0x48),
               *(undefined8 *)(in_RDI + 0x38));
    (**(code **)*local_130)();
    (*(local_28.m_dispatcher1)->_vptr_btDispatcher[0xf])(local_28.m_dispatcher1,local_130);
  }
  return;
}

Assistant:

void btSoftBodyTriangleCallback::processTriangle(btVector3* triangle,int partId, int triangleIndex)
{
	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);
	
	btCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &btIDebugDraw::DBG_DrawWireframe))
	{
		btVector3 color(1,1,0);
		const btTransform& tr = m_triBody->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}

	btTriIndex	triIndex(partId,triangleIndex,0);
	btHashKey<btTriIndex> triKey(triIndex.getUid());


	btTriIndex* shapeIndex = m_shapeCache[triKey];
	if (shapeIndex)
	{
		btCollisionShape* tm = shapeIndex->m_childShape;
		btAssert(tm);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		//btCollisionObjectWrapper triBody(0,tm, ob, btTransform::getIdentity());//ob->getWorldTransform());//??
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
		
		return;
	}

	//aabb filter is already applied!	

	//btCollisionObject* colObj = static_cast<btCollisionObject*>(m_convexProxy->m_clientObject);

	//	if (m_softBody->getCollisionShape()->getShapeType()==
	{
		//		btVector3 other;
		btVector3 normal = (triangle[1]-triangle[0]).cross(triangle[2]-triangle[0]);
		normal.normalize();
		normal*= BT_SOFTBODY_TRIANGLE_EXTRUSION;
		//		other=(triangle[0]+triangle[1]+triangle[2])*0.333333f;
		//		other+=normal*22.f;
		btVector3	pts[6] = {triangle[0]+normal,
			triangle[1]+normal,
			triangle[2]+normal,
			triangle[0]-normal,
			triangle[1]-normal,
			triangle[2]-normal};

		btConvexHullShape* tm = new btConvexHullShape(&pts[0].getX(),6);


		//		btBU_Simplex1to4 tm(triangle[0],triangle[1],triangle[2],other);

		//btTriangleShape tm(triangle[0],triangle[1],triangle[2]);	
		//	tm.setMargin(m_collisionMarginTriangle);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		
		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);//btTransform::getIdentity());//??

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);

		triIndex.m_childShape = tm;
		m_shapeCache.insert(triKey,triIndex);

	}



}